

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostinfo.c
# Opt level: O3

void h2o_hostinfo_getaddr_receiver(h2o_multithread_receiver_t *receiver,h2o_linklist_t *messages)

{
  h2o_linklist_t *phVar1;
  st_h2o_linklist_t *psVar2;
  st_h2o_linklist_t *psVar3;
  
  phVar1 = messages->next;
  while (phVar1 != messages) {
    psVar2 = phVar1->next;
    psVar3 = phVar1->prev;
    psVar2->prev = psVar3;
    psVar3->next = psVar2;
    phVar1->next = (st_h2o_linklist_t *)0x0;
    phVar1->prev = (st_h2o_linklist_t *)0x0;
    psVar2 = phVar1[-2].next;
    if (psVar2 != (st_h2o_linklist_t *)0x0) {
      phVar1[-2].next = (st_h2o_linklist_t *)0x0;
      (*(code *)psVar2)(&phVar1[-3].prev,phVar1[1].next,phVar1[1].prev,phVar1[-2].prev);
    }
    if ((addrinfo *)phVar1[1].prev != (addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)phVar1[1].prev);
    }
    free(&phVar1[-3].prev);
    phVar1 = messages->next;
  }
  return;
}

Assistant:

void h2o_hostinfo_getaddr_receiver(h2o_multithread_receiver_t *receiver, h2o_linklist_t *messages)
{
    while (!h2o_linklist_is_empty(messages)) {
        h2o_hostinfo_getaddr_req_t *req = H2O_STRUCT_FROM_MEMBER(h2o_hostinfo_getaddr_req_t, _out.message.link, messages->next);
        h2o_linklist_unlink(&req->_out.message.link);
        h2o_hostinfo_getaddr_cb cb = req->_cb;
        if (cb != NULL) {
            req->_cb = NULL;
            cb(req, req->_out.errstr, req->_out.ai, req->cbdata);
        }
        if (req->_out.ai != NULL)
            freeaddrinfo(req->_out.ai);
        free(req);
    }
}